

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  aom_image_t *img;
  uint *in_RSI;
  long in_RDI;
  int i;
  av1_ext_ref_frame_t *ext_frames;
  av1_ext_ref_frame_t *data;
  long *local_40;
  int local_2c;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_40 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_40 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_40 + 1;
  }
  puVar2 = (undefined8 *)*local_40;
  if (puVar2 == (undefined8 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *(undefined4 *)(in_RDI + 0x69d8) = *(undefined4 *)(puVar2 + 1);
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x69d8); local_2c = local_2c + 1) {
      img = (aom_image_t *)*puVar2;
      *puVar2 = img + 1;
      image2yuvconfig(img,(YV12_BUFFER_CONFIG *)(in_RDI + 0x1d8 + (long)local_2c * 0xd0));
    }
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  av1_ext_ref_frame_t *const data = va_arg(args, av1_ext_ref_frame_t *);

  if (data) {
    av1_ext_ref_frame_t *const ext_frames = data;
    ctx->ext_refs.num = ext_frames->num;
    for (int i = 0; i < ctx->ext_refs.num; i++) {
      image2yuvconfig(ext_frames->img++, &ctx->ext_refs.refs[i]);
    }
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}